

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  memory_buffer buf;
  parse_context local_268;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_248;
  undefined **local_228;
  undefined1 *local_220;
  long local_218;
  ulong local_210;
  undefined1 local_208 [504];
  
  local_218 = 0;
  local_228 = &PTR_grow_00134948;
  local_210 = 500;
  local_268.format_str_.data_ = (char *)0x0;
  local_268.format_str_.size_ = 0;
  local_268.next_arg_id_ = 0;
  local_248.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_228;
  local_248.args_.desc_ = 0;
  local_248.loc_.locale_ = (void *)0x0;
  local_220 = local_208;
  (*h.custom_.format)(h.custom_.value,&local_268,&local_248);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_220,local_220 + local_218);
  if (local_220 != local_208) {
    operator_delete(local_220,local_210);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }